

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

void Search::ensure_param(float *v,float lo,float hi,float def,char *string)

{
  size_t sVar1;
  
  if ((*v < lo) || (hi < *v)) {
    if (string == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x2d4a18);
    }
    else {
      sVar1 = strlen(string);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,string,sVar1);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x18');
    std::ostream::put('\x18');
    std::ostream::flush();
    *v = def;
  }
  return;
}

Assistant:

void ensure_param(float& v, float lo, float hi, float def, const char* string)
{
  if ((v < lo) || (v > hi))
  {
    std::cerr << string << endl;
    v = def;
  }
}